

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::ForAllUnionVariantsBesidesNone
          (RustGenerator *this,EnumDef *def,function<void_(const_flatbuffers::EnumVal_&)> *cb)

{
  EnumVal *v;
  Namespace *ns;
  StructDef *name;
  allocator<char> local_b9;
  CodeWriter *local_b8;
  IdlNamer *local_b0;
  EnumDef *local_a8;
  function<void_(const_flatbuffers::EnumVal_&)> *local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_a0 = cb;
  if (def->is_union != false) {
    local_b8 = &this->code_;
    local_b0 = &this->namer_;
    local_a8 = def;
    for (local_98 = (def->vals).vec.
                    super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_98 !=
        (local_a8->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; local_98 = local_98 + 1) {
      v = *local_98;
      if ((v->union_type).base_type != BASE_TYPE_NONE) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"U_ELEMENT_ENUM_TYPE",&local_b9);
        ns = (local_a8->super_Definition).defined_namespace;
        IdlNamer::EnumVariant_abi_cxx11_(&local_90,local_b0,local_a8,v);
        WrapInNameSpace(&local_70,this,ns,&local_90);
        CodeWriter::SetValue(local_b8,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"U_ELEMENT_TABLE_TYPE",(allocator<char> *)&local_90);
        name = (v->union_type).struct_def;
        WrapInNameSpace(&local_70,this,(name->super_Definition).defined_namespace,(string *)name);
        CodeWriter::SetValue(local_b8,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"U_ELEMENT_NAME",(allocator<char> *)&local_90);
        (*(this->namer_).super_Namer._vptr_Namer[0x14])
                  (&local_70,local_b0,v,(ulong)(this->namer_).super_Namer.config_.functions);
        CodeWriter::SetValue(local_b8,&local_50,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::function<void_(const_flatbuffers::EnumVal_&)>::operator()(local_a0,v);
      }
    }
    return;
  }
  __assert_fail("def.is_union",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x63a,
                "void flatbuffers::rust::RustGenerator::ForAllUnionVariantsBesidesNone(const EnumDef &, std::function<void (const EnumVal &)>)"
               );
}

Assistant:

void ForAllUnionVariantsBesidesNone(
      const EnumDef &def, std::function<void(const EnumVal &ev)> cb) {
    FLATBUFFERS_ASSERT(def.is_union);

    for (auto it = def.Vals().begin(); it != def.Vals().end(); ++it) {
      const EnumVal &ev = **it;
      // TODO(cneo): Can variants be deprecated, should we skip them?
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_.SetValue(
          "U_ELEMENT_ENUM_TYPE",
          WrapInNameSpace(def.defined_namespace, namer_.EnumVariant(def, ev)));
      code_.SetValue(
          "U_ELEMENT_TABLE_TYPE",
          WrapInNameSpace(ev.union_type.struct_def->defined_namespace,
                          ev.union_type.struct_def->name));
      code_.SetValue("U_ELEMENT_NAME", namer_.Function(ev.name));
      cb(ev);
    }
  }